

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ptr<snapshot> __thiscall nuraft::raft_server::get_last_snapshot(raft_server *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nuraft::snapshot> *in_RSI;
  element_type *in_RDI;
  ptr<snapshot> pVar1;
  lock_guard<std::mutex> l;
  ptr<snapshot> *ret;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RSI,(mutex_type *)in_RDI);
  std::shared_ptr<nuraft::snapshot>::shared_ptr(in_RSI,(shared_ptr<nuraft::snapshot> *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x272040);
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<snapshot>)pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> raft_server::get_last_snapshot() const {
    std::lock_guard<std::mutex> l(last_snapshot_lock_);
    ptr<snapshot> ret = last_snapshot_;
    return ret;
}